

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

void __thiscall
QColumnViewPrivate::checkColumnCreation(QColumnViewPrivate *this,QModelIndex *parent)

{
  QAbstractItemModel *pQVar1;
  QAbstractItemView *this_00;
  char cVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::currentIndex
            (&local_48,
             *(QAbstractItemView **)
              &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
               super_QFramePrivate.super_QWidgetPrivate.field_0x8);
  if ((((parent->r == local_48.r) && (parent->c == local_48.c)) && (parent->i == local_48.i)) &&
     ((parent->m).ptr == local_48.m.ptr)) {
    pQVar1 = (this->super_QAbstractItemViewPrivate).model;
    cVar2 = (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,parent);
    if ((cVar2 != '\0') && ((this->columns).d.size != 0)) {
      uVar3 = 0;
      do {
        this_00 = (QAbstractItemView *)(this->columns).d.ptr[uVar3];
        QAbstractItemView::rootIndex(&local_48,this_00);
        if (((local_48.r == parent->r) && (local_48.c == parent->c)) &&
           ((local_48.i == parent->i && (local_48.m.ptr == (parent->m).ptr)))) {
          if (this_00 == (QAbstractItemView *)this->previewColumn) {
            closeColumns(this,parent,false);
            createColumn(this,parent,true);
          }
          break;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)(this->columns).d.size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewPrivate::checkColumnCreation(const QModelIndex &parent)
{
    if (parent == q_func()->currentIndex() && model->hasChildren(parent)) {
        //the parent has children and is the current
        //let's try to find out if there is already a mapping that is good
        for (int i = 0; i < columns.size(); ++i) {
            QAbstractItemView *view = columns.at(i);
            if (view->rootIndex() == parent) {
                if (view == previewColumn) {
                    //let's recreate the parent
                    closeColumns(parent, false);
                    createColumn(parent, true /*show*/);
                }
                break;
            }
        }
    }
}